

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O0

sbfPoolItem sbfPoolNextItem(sbfPool pool)

{
  long in_RDI;
  uint64_t value;
  sbfPoolItem item;
  sbfPoolItem local_10;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x10));
  local_10 = *(sbfPoolItem *)(in_RDI + 0x18);
  if (local_10 == (sbfPoolItem)0x0) {
    local_10 = (sbfPoolItem)sbfAtomic_swap((int64_t *)(in_RDI + 0x20),0);
  }
  if (local_10 != (sbfPoolItem)0x0) {
    *(sbfPoolItemImpl **)(in_RDI + 0x18) = local_10->mNext;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x10));
  return local_10;
}

Assistant:

static SBF_INLINE sbfPoolItem
sbfPoolNextItem (sbfPool pool)
{
    sbfPoolItem item;
    uint64_t    value;

    sbfSpinLock_lock (&pool->mLock);

    item = pool->mAvailable;
    if (item == NULL)
    {
        value = sbfAtomic_swap ((volatile int64_t*)&pool->mFree,
                             (int64_t)NULL);
        item = (sbfPoolItem)value;
    }
    if (item != NULL)
        pool->mAvailable = item->mNext;

    sbfSpinLock_unlock (&pool->mLock);
    return item;
}